

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall
args::PositionalList<int,_args::detail::vector,_args::ValueReader>::~PositionalList
          (PositionalList<int,_args::detail::vector,_args::ValueReader> *this)

{
  PositionalList<int,_args::detail::vector,_args::ValueReader> *this_local;
  
  (this->super_PositionalBase).super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&PTR__PositionalList_00367078;
  std::vector<int,_std::allocator<int>_>::~vector(&this->defaultValues);
  std::vector<int,_std::allocator<int>_>::~vector(&this->values);
  PositionalBase::~PositionalBase(&this->super_PositionalBase);
  return;
}

Assistant:

virtual ~PositionalList() {}